

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

string * __thiscall
google::protobuf::internal::ExtensionSet::MutableString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  Arena *this_00;
  Extension *pEVar1;
  string *psVar2;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar3;
  
  pVar3 = Insert(this,number);
  pEVar1 = pVar3.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    psVar2 = (string *)(pEVar1->field_0).int64_value;
  }
  else {
    pEVar1->type = type;
    pEVar1->is_repeated = false;
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) {
      psVar2 = (string *)operator_new(0x20);
    }
    else {
      Arena::AllocHook(this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
      psVar2 = (string *)
               ArenaImpl::AllocateAlignedAndAddCleanup
                         (&this_00->impl_,0x20,arena_destruct_object<std::__cxx11::string>);
    }
    (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
    psVar2->_M_string_length = 0;
    (psVar2->field_2)._M_local_buf[0] = '\0';
    (pEVar1->field_0).string_value = psVar2;
  }
  pEVar1->field_0xa = pEVar1->field_0xa & 0xf0;
  return psVar2;
}

Assistant:

std::string* ExtensionSet::MutableString(int number, FieldType type,
                                         const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = false;
    extension->string_value = Arena::Create<std::string>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, STRING);
  }
  extension->is_cleared = false;
  return extension->string_value;
}